

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O2

string * cmGlobalNinjaGenerator::EncodeRuleName(string *__return_storage_ptr__,string *name)

{
  char cVar1;
  pointer pcVar2;
  size_type sVar3;
  int iVar4;
  size_type sVar5;
  char buf [16];
  char acStack_48 [24];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pcVar2 = (name->_M_dataplus)._M_p;
  sVar3 = name->_M_string_length;
  for (sVar5 = 0; sVar3 != sVar5; sVar5 = sVar5 + 1) {
    cVar1 = pcVar2[sVar5];
    iVar4 = isalnum((int)cVar1);
    if (((iVar4 == 0) && (cVar1 != '_')) && (cVar1 != '-')) {
      sprintf(acStack_48,".%02x",(ulong)(uint)(int)cVar1);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    else {
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGlobalNinjaGenerator::EncodeRuleName(std::string const& name)
{
  // Ninja rule names must match "[a-zA-Z0-9_.-]+".  Use ".xx" to encode
  // "." and all invalid characters as hexadecimal.
  std::string encoded;
  for (char i : name) {
    if (isalnum(i) || i == '_' || i == '-') {
      encoded += i;
    } else {
      char buf[16];
      sprintf(buf, ".%02x", static_cast<unsigned int>(i));
      encoded += buf;
    }
  }
  return encoded;
}